

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

void * __thiscall
Fossilize::StateRecorder::Impl::copy_pnext_struct
          (Impl *this,VkPipelineShaderStageModuleIdentifierCreateInfoEXT *create_info,
          ScratchAllocator *alloc)

{
  VkPipelineShaderStageModuleIdentifierCreateInfoEXT *pVVar1;
  uchar *puVar2;
  size_t count;
  
  pVVar1 = copy<VkPipelineShaderStageModuleIdentifierCreateInfoEXT>(this,create_info,1,alloc);
  count = 0x20;
  if (pVVar1->identifierSize < 0x20) {
    count = (size_t)pVVar1->identifierSize;
  }
  pVVar1->identifierSize = (uint32_t)count;
  puVar2 = copy<unsigned_char>(this,pVVar1->pIdentifier,count,alloc);
  pVVar1->pIdentifier = puVar2;
  return pVVar1;
}

Assistant:

void *StateRecorder::Impl::copy_pnext_struct(const VkPipelineShaderStageModuleIdentifierCreateInfoEXT *create_info,
                                             ScratchAllocator &alloc)
{
	auto *identifier = copy(create_info, 1, alloc);
	// Safeguard since we'll be copying these to stack variables later.
	identifier->identifierSize =
			std::min<uint32_t>(identifier->identifierSize, VK_MAX_SHADER_MODULE_IDENTIFIER_SIZE_EXT);
	identifier->pIdentifier = copy(identifier->pIdentifier, identifier->identifierSize, alloc);
	return identifier;
}